

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O2

void cmime_header_set_name(CMimeHeader_T *header,char *name)

{
  uint __line;
  char *pcVar1;
  
  if (header == (CMimeHeader_T *)0x0) {
    pcVar1 = "header";
    __line = 0x38;
  }
  else {
    if (name != (char *)0x0) {
      free(header->name);
      pcVar1 = strdup(name);
      header->name = pcVar1;
      return;
    }
    pcVar1 = "name";
    __line = 0x39;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,__line,"void cmime_header_set_name(CMimeHeader_T *, const char *)");
}

Assistant:

void cmime_header_set_name(CMimeHeader_T *header, const char *name) {
    assert(header);
    assert(name);
    
    if (header->name != NULL) 
        free(header->name);
    
    header->name = strdup(name);
}